

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

void proxy_update_registration(proxy_handle *ph)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  ulong slots_used;
  
  pvVar2 = ph->priv;
  mutex_lock_shared((mutex_handle *)((long)pvVar2 + 0x870));
  uVar1 = *(uint *)((long)pvVar2 + 0x83c);
  slots_used = (ulong)*(int *)((long)pvVar2 + 0x838);
  mutex_unlock_shared((mutex_handle *)((long)pvVar2 + 0x870));
  mutex_lock_shared((mutex_handle *)((long)pvVar2 + 0x880));
  for (plVar3 = (long *)((long)pvVar2 + 0x820); *plVar3 != 0; plVar3 = (long *)(*plVar3 + 0x10)) {
    slots_used = slots_used - 1;
  }
  mutex_unlock_shared((mutex_handle *)((long)pvVar2 + 0x880));
  proxy_log(ph,LOG_LEVEL_DEBUG,"Sending update to registrar (%d/%d)\n",slots_used & 0xffffffff,
            (ulong)uVar1);
  registration_service_update
            ((registration_service_handle *)((long)pvVar2 + 0x888),slots_used,(long)(int)uVar1);
  return;
}

Assistant:

void proxy_update_registration(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	struct proxy_worker *pw;
	int slots_used;
	int slots_total;

	mutex_lock_shared(&priv->usable_clients_mutex);
	slots_total = priv->usable_clients;
	slots_used = priv->num_clients;
	mutex_unlock_shared(&priv->usable_clients_mutex);

	mutex_lock_shared(&priv->idle_workers_mutex);
	for (pw = priv->idle_workers_head; pw != NULL; pw = pw->next)
		slots_used--;
	mutex_unlock_shared(&priv->idle_workers_mutex);

	proxy_log(ph, LOG_LEVEL_DEBUG,
		  "Sending update to registrar (%d/%d)\n",
		  slots_used, slots_total);

	registration_service_update(&priv->reg_service, slots_used,
				    slots_total);
}